

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

int __thiscall
QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>::remove
          (QMetaTypeFunctionRegistry<std::function<bool_(void_*,_void_*)>,_std::pair<int,_int>_>
           *this,char *__filename)

{
  long in_FS_OFFSET;
  pair<int,_int> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.first = (int)__filename;
  QReadWriteLock::lockForWrite((QReadWriteLock *)this);
  QHash<std::pair<int,int>,std::function<bool(void*,void*)>>::removeImpl<std::pair<int,int>>
            ((QHash<std::pair<int,int>,std::function<bool(void*,void*)>> *)(this + 8),&local_20);
  QReadWriteLock::unlock((QReadWriteLock *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void remove(int from, int to)
    {
        const Key k(from, to);
        const QWriteLocker locker(&lock);
        map.remove(k);
    }